

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O3

int VP8Decimate(VP8EncIterator *it,VP8ModeScore *rd,VP8RDLevel rd_opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  char cVar5;
  byte bVar6;
  ushort uVar7;
  byte *pbVar8;
  DError *paaiVar9;
  undefined8 uVar10;
  bool bVar11;
  ushort uVar12;
  int iVar13;
  uint32_t uVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  uint16_t *puVar24;
  VP8MBInfo *pVVar25;
  uint uVar26;
  int16_t *piVar27;
  long lVar28;
  uint8_t *puVar29;
  undefined1 *puVar30;
  ushort uVar31;
  int iVar32;
  long lVar33;
  uint8_t *puVar34;
  long lVar35;
  uint16_t *puVar36;
  uint8_t *puVar37;
  uint8_t *puVar38;
  ushort uVar39;
  uint8_t *puVar40;
  char cVar41;
  ulong uVar42;
  VP8Encoder *pVVar43;
  uint8_t *puVar44;
  uint8_t *puVar45;
  VP8ModeScore *rd_00;
  VP8ModeScore *pVVar46;
  ulong uVar47;
  VP8ModeScore *__src;
  bool bVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  uint32_t v;
  score_t local_490;
  int local_480;
  long local_470;
  long local_460;
  long local_458;
  long lStack_450;
  ulong local_430;
  long local_420;
  long local_3f8;
  long local_3f0;
  long local_3e8;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  long local_388;
  undefined8 local_360 [64];
  undefined1 local_160 [2];
  undefined1 local_15e [278];
  uint local_48;
  int8_t local_44 [3];
  int8_t local_40 [16];
  
  iVar20 = it->enc_->method_;
  rd->nz = 0;
  rd->D = 0;
  rd->SD = 0;
  rd->H = 0;
  rd->R = 0;
  rd->score = 0x7fffffffffffff;
  if (it->x_ == 0) {
    puVar40 = (uint8_t *)0x0;
  }
  else {
    puVar40 = it->y_left_;
  }
  local_420 = 0x7fffffffffffff;
  if (it->y_ == 0) {
    puVar29 = (uint8_t *)0x0;
  }
  else {
    puVar29 = it->y_top_;
  }
  (*VP8EncPredLuma16)(it->yuv_p_,puVar40,puVar29);
  if (it->x_ == 0) {
    puVar40 = (uint8_t *)0x0;
  }
  else {
    puVar40 = it->u_left_;
  }
  if (it->y_ == 0) {
    puVar29 = (uint8_t *)0x0;
  }
  else {
    puVar29 = it->uv_top_;
  }
  (*VP8EncPredChroma8)(it->yuv_p_,puVar40,puVar29);
  if (rd_opt != RD_OPT_NONE) {
    it->do_trellis_ = (uint)(RD_OPT_TRELLIS < rd_opt);
    pbVar8 = it->yuv_in_;
    pVVar43 = it->enc_;
    uVar26 = *(byte *)it->mb_ >> 5 & 3;
    lVar21 = (long)pVVar43->dqm_[uVar26].lambda_i16_;
    lStack_450 = local_458;
    local_458 = lVar21;
    iVar18 = pVVar43->dqm_[uVar26].tlambda_;
    iVar13 = (uint)*pbVar8 * 0x1010101;
    local_3a8._0_4_ = iVar13;
    bVar48 = false;
    lVar22 = 0;
    do {
      bVar11 = bVar48;
      if ((((*(int *)(pbVar8 + lVar22) != iVar13) || (*(int *)(pbVar8 + lVar22 + 4) != iVar13)) ||
          (*(int *)(pbVar8 + lVar22 + 8) != iVar13)) ||
         (bVar11 = false, *(int *)(pbVar8 + lVar22 + 0xc) != iVar13)) goto LAB_0013615a;
      lVar22 = lVar22 + 0x20;
    } while ((int)lVar22 != 0x200);
    bVar11 = true;
LAB_0013615a:
    rd->mode_i16 = -1;
    lVar22 = 0;
    rd_00 = (VP8ModeScore *)local_3a8;
    __src = rd;
    do {
      puVar40 = it->yuv_out2_;
      rd_00->mode_i16 = (int)lVar22;
      uVar14 = ReconstructIntra16(it,rd_00,puVar40,(int)lVar22);
      rd_00->nz = uVar14;
      iVar13 = (*VP8SSE16x16)(pbVar8,puVar40);
      rd_00->D = (long)iVar13;
      if (iVar18 == 0) {
        lVar23 = 0;
      }
      else {
        iVar13 = (*VP8TDisto16x16)(pbVar8,puVar40,kWeightY);
        lVar23 = (long)(iVar13 * iVar18 + 0x80 >> 8);
      }
      rd_00->SD = lVar23;
      rd_00->H = (ulong)VP8FixedCostsI16[lVar22];
      iVar13 = VP8GetCostLuma16(it,rd_00);
      rd_00->R = (long)iVar13;
      if (bVar11) {
        piVar27 = rd_00->y_ac_levels[0] + 1;
        iVar32 = 0;
        uVar19 = 0x10;
        do {
          lVar23 = 0;
          do {
            bVar48 = SCARRY4((uint)(piVar27[lVar23] != 0),iVar32);
            iVar32 = (uint)(piVar27[lVar23] != 0) + iVar32;
            if (iVar32 != 0 && bVar48 == iVar32 < 0) goto LAB_0013626f;
            lVar23 = lVar23 + 1;
          } while (lVar23 != 0xf);
          piVar27 = piVar27 + 0x10;
          bVar48 = 1 < uVar19;
          uVar19 = uVar19 - 1;
        } while (bVar48);
        rd_00->D = rd_00->D * 2;
        rd_00->SD = rd_00->SD * 2;
        bVar11 = true;
      }
      else {
LAB_0013626f:
        bVar11 = false;
      }
      lVar23 = (rd_00->SD + rd_00->D) * 0x100 + ((long)iVar13 + rd_00->H) * lVar21;
      rd_00->score = lVar23;
      if ((lVar22 == 0) || (pVVar46 = rd_00, lVar23 < __src->score)) {
        uVar1 = it->yuv_out_;
        uVar3 = it->yuv_out2_;
        auVar49._8_4_ = (int)uVar1;
        auVar49._0_8_ = uVar3;
        auVar49._12_4_ = (int)((ulong)uVar1 >> 0x20);
        it->yuv_out_ = (uint8_t *)uVar3;
        it->yuv_out2_ = (uint8_t *)auVar49._8_8_;
        pVVar46 = __src;
        __src = rd_00;
      }
      lVar22 = lVar22 + 1;
      rd_00 = pVVar46;
    } while (lVar22 != 4);
    if (__src != rd) {
      memcpy(rd,__src,0x370);
    }
    rd->score = (rd->SD + rd->D) * 0x100 +
                (rd->H + rd->R) * (long)pVVar43->dqm_[uVar26].lambda_mode_;
    VP8SetIntra16Mode(it,rd->mode_i16);
    if (((rd->nz & 0x100ffff) == 0x1000000) && ((long)pVVar43->dqm_[uVar26].min_disto_ < rd->D)) {
      uVar12 = rd->y_dc_levels[1];
      uVar7 = rd->y_dc_levels[2];
      uVar31 = -uVar12;
      if (0 < (short)uVar12) {
        uVar31 = uVar12;
      }
      uVar12 = -uVar7;
      if (0 < (short)uVar7) {
        uVar12 = uVar7;
      }
      uVar7 = rd->y_dc_levels[4];
      uVar39 = -uVar7;
      if (0 < (short)uVar7) {
        uVar39 = uVar7;
      }
      if (uVar31 < uVar12) {
        uVar31 = uVar12;
      }
      if (uVar39 <= uVar31) {
        uVar39 = uVar31;
      }
      if (pVVar43->dqm_[uVar26].max_edge_ < (int)(uint)uVar39) {
        pVVar43->dqm_[uVar26].max_edge_ = (uint)uVar39;
      }
    }
    pVVar43 = it->enc_;
    pVVar25 = it->mb_;
    puVar40 = it->yuv_in_;
    puVar29 = it->yuv_out2_;
    if (1 < iVar20) {
      if (pVVar43->max_i4_header_bits_ != 0) {
        uVar26 = *(byte *)pVVar25 >> 5 & 3;
        lVar21 = (long)pVVar43->dqm_[uVar26].lambda_i4_;
        iVar20 = pVVar43->dqm_[uVar26].tlambda_;
        local_48 = 0;
        local_3a8 = (undefined1  [16])0x0;
        local_398 = ZEXT816(0xd3);
        local_388 = (long)pVVar43->dqm_[uVar26].lambda_mode_ * 0xd3;
        VP8IteratorStartI4(it);
        puVar45 = rd->modes_i4;
        iVar18 = 0;
        do {
          uVar12 = VP8Scan[it->i4_];
          puVar44 = puVar40 + uVar12;
          puVar24 = GetCostModeI4(it,puVar45);
          puVar34 = puVar29 + uVar12;
          puVar37 = it->yuv_p_;
          (*VP8EncPredLuma4)(puVar37,it->i4_top_);
          local_458._0_4_ = 0xffffffff;
          lVar23 = 0;
          local_3f0 = 0;
          local_3e8 = 0;
          local_430 = 0;
          uVar19 = 0;
          lVar22 = 0x7fffffffffffff;
          local_3f8 = 0;
          puVar37 = puVar37 + 0x688;
          do {
            iVar32 = ReconstructIntra4(it,(int16_t *)&local_3c8,puVar44,puVar37,(int)lVar23);
            iVar13 = it->i4_;
            iVar15 = (*VP8SSE4x4)(puVar44,puVar37);
            if (iVar20 == 0) {
              lVar33 = 0;
            }
            else {
              iVar16 = (*VP8TDisto4x4)(puVar44,puVar37,kWeightY);
              lVar33 = (long)(iVar16 * iVar20 + 0x80 >> 8);
            }
            uVar42 = (ulong)puVar24[lVar23];
            if (lVar23 == 0) {
LAB_0013658b:
              lVar28 = 0;
            }
            else {
              uVar17 = 0;
              lVar28 = 1;
              do {
                uVar17 = (uVar17 + 1) - (uint)(*(short *)((long)&local_3c8 + lVar28 * 2) == 0);
                if (3 < uVar17) goto LAB_0013658b;
                lVar28 = lVar28 + 1;
              } while (lVar28 != 0x10);
              lVar28 = 0x8c;
            }
            lVar35 = (lVar33 + iVar15) * 0x100;
            puVar38 = puVar37;
            if (((int)local_458 < 0) || ((long)((uVar42 + lVar28) * lVar21 + lVar35) < lVar22)) {
              iVar16 = VP8GetCostLuma4(it,(int16_t *)&local_3c8);
              lVar35 = (uVar42 + lVar28 + iVar16) * lVar21 + lVar35;
              if (((int)local_458 < 0) || (lVar35 < lVar22)) {
                lVar22 = (long)it->i4_;
                local_360[lVar22 * 4 + 2] = local_3b8;
                local_360[lVar22 * 4 + 3] = uStack_3b0;
                local_360[lVar22 * 4] = local_3c8;
                local_360[lVar22 * 4 + 1] = uStack_3c0;
                local_458._0_4_ = (int)lVar23;
                lVar22 = lVar35;
                puVar38 = puVar34;
                puVar34 = puVar37;
                local_430 = uVar42;
                local_3f8 = lVar28 + iVar16;
                local_3f0 = (long)iVar15;
                local_3e8 = lVar33;
                uVar19 = iVar32 << ((byte)iVar13 & 0x1f);
              }
            }
            lVar23 = lVar23 + 1;
            puVar37 = puVar38;
          } while (lVar23 != 10);
          local_3a8._8_8_ = local_3a8._8_8_ + local_3e8;
          local_3a8._0_8_ = local_3a8._0_8_ + local_3f0;
          local_398._8_8_ = local_398._8_8_ + local_3f8;
          local_398._0_8_ = local_398._0_8_ + local_430;
          local_48 = local_48 | uVar19;
          local_388 = (local_3f0 + local_3e8) * 0x100 +
                      (local_430 + local_3f8) * (long)pVVar43->dqm_[uVar26].lambda_mode_ + local_388
          ;
          if ((rd->score <= local_388) ||
             (iVar18 = iVar18 + (int)local_430, pVVar43->max_i4_header_bits_ < iVar18)) {
            puVar29 = it->yuv_out2_;
            goto LAB_00136b78;
          }
          iVar13 = it->i4_;
          lVar22 = (long)iVar13;
          if (puVar34 != puVar29 + VP8Scan[lVar22]) {
            (*VP8Copy4x4)(puVar34,puVar29 + VP8Scan[lVar22]);
            iVar13 = it->i4_;
            lVar22 = (long)iVar13;
          }
          puVar45[lVar22] = (uint8_t)local_458;
          it->left_nz_[iVar13 >> 2] = (uint)(uVar19 != 0);
          it->top_nz_[it->i4_ & 3] = (uint)(uVar19 != 0);
          iVar13 = VP8IteratorRotateI4(it,puVar29);
        } while (iVar13 != 0);
        rd->D = local_3a8._0_8_;
        rd->SD = local_3a8._8_8_;
        rd->H = local_398._0_8_;
        rd->R = local_398._8_8_;
        rd->nz = local_48;
        rd->score = local_388;
        VP8SetIntra4Mode(it,puVar45);
        puVar29 = it->yuv_out_;
        it->yuv_out_ = it->yuv_out2_;
        it->yuv_out2_ = puVar29;
        memcpy(rd->y_ac_levels,local_360,0x200);
      }
LAB_00136b78:
      puVar40 = it->yuv_in_;
      pVVar43 = it->enc_;
      pVVar25 = it->mb_;
    }
    iVar20 = pVVar43->dqm_[*(byte *)pVVar25 >> 5 & 3].lambda_uv_;
    puVar29 = puVar29 + 0x10;
    puVar44 = it->yuv_out_ + 0x10;
    rd->mode_uv = -1;
    local_458 = 0;
    lStack_450 = 0;
    lVar21 = 0;
    local_480 = -1;
    local_470 = 0;
    uVar26 = 0;
    local_460 = 0;
    puVar45 = puVar44;
    do {
      iVar13 = (int)lVar21;
      local_48 = ReconstructUV(it,(VP8ModeScore *)local_3a8,puVar29,iVar13);
      iVar18 = (*VP8SSE16x8)(puVar40 + 0x10,puVar29);
      auVar49 = local_398;
      local_3a8._8_8_ = 0;
      local_3a8._0_8_ = (long)iVar18;
      local_398._2_6_ = 0;
      local_398._0_2_ = VP8FixedCostsUV[lVar21];
      local_398._8_8_ = auVar49._8_8_;
      iVar18 = VP8GetCostUV(it,(VP8ModeScore *)local_3a8);
      uVar19 = local_48;
      lVar22 = (long)iVar18;
      if (lVar21 != 0) {
        iVar18 = 0;
        puVar30 = local_15e;
        uVar17 = 8;
        do {
          lVar23 = 0;
          do {
            iVar18 = (iVar18 + 1) - (uint)(*(short *)(puVar30 + lVar23 * 2) == 0);
            if (2 < iVar18) goto LAB_00136ce5;
            lVar23 = lVar23 + 1;
          } while (lVar23 != 0xf);
          puVar30 = puVar30 + 0x20;
          bVar48 = 1 < uVar17;
          uVar17 = uVar17 - 1;
        } while (bVar48);
        lVar22 = lVar22 + 0x460;
      }
LAB_00136ce5:
      uVar10 = local_398._0_8_;
      lVar23 = (local_3a8._8_8_ + local_3a8._0_8_) * 0x100 +
               (local_398._0_8_ + lVar22) * (long)iVar20;
      if ((lVar21 == 0) || (puVar37 = puVar29, lVar23 < local_420)) {
        local_458 = local_3a8._0_8_;
        lStack_450 = local_3a8._8_8_;
        rd->mode_uv = iVar13;
        memcpy(rd->uv_levels,local_160,0x100);
        if (it->top_derr_ != (DError *)0x0) {
          *(undefined2 *)(rd->derr[1] + 1) = local_40._0_2_;
          *(undefined4 *)rd->derr = _local_44;
        }
        local_460 = uVar10;
        puVar37 = puVar45;
        puVar45 = puVar29;
        local_470 = lVar22;
        local_420 = lVar23;
        local_480 = iVar13;
        uVar26 = uVar19;
      }
      puVar29 = puVar37;
      lVar21 = lVar21 + 1;
    } while (lVar21 != 4);
    VP8SetIntraUVMode(it,local_480);
    rd->D = rd->D + local_458;
    rd->SD = rd->SD + lStack_450;
    rd->R = rd->R + local_470;
    rd->H = rd->H + local_460;
    rd->nz = rd->nz | uVar26;
    rd->score = rd->score + local_420;
    if (puVar45 != puVar44) {
      (*VP8Copy16x8)(puVar45,puVar44);
    }
    paaiVar9 = it->top_derr_;
    if (paaiVar9 != (DError *)0x0) {
      iVar20 = it->x_;
      lVar21 = 0;
      bVar48 = true;
      do {
        bVar11 = bVar48;
        it->left_derr_[lVar21][0] = rd->derr[lVar21][0];
        cVar5 = rd->derr[lVar21][2];
        cVar41 = (char)((uint)(cVar5 * 3) >> 2);
        it->left_derr_[lVar21][1] = cVar41;
        paaiVar9[iVar20][lVar21][0] = rd->derr[lVar21][1];
        paaiVar9[iVar20][lVar21][1] = cVar5 - cVar41;
        lVar21 = 1;
        bVar48 = false;
      } while (bVar11);
    }
    if (rd_opt == RD_OPT_TRELLIS) {
      it->do_trellis_ = 1;
      if (((uint)*it->mb_ & 3) == 1) {
        uVar19 = ReconstructIntra16(it,rd,it->yuv_out_,(uint)*it->preds_);
      }
      else {
        pVVar43 = it->enc_;
        VP8IteratorStartI4(it);
        uVar19 = 0;
        do {
          uVar26 = it->i4_;
          uVar12 = VP8Scan[(int)uVar26];
          bVar6 = it->preds_[(int)(((int)uVar26 >> 2) * pVVar43->preds_w_ + (uVar26 & 3))];
          puVar40 = it->yuv_in_;
          puVar29 = it->yuv_out_;
          (*VP8EncPredLuma4)(it->yuv_p_,it->i4_top_);
          iVar20 = ReconstructIntra4(it,rd->y_ac_levels[it->i4_],puVar40 + uVar12,puVar29 + uVar12,
                                     (uint)bVar6);
          uVar19 = uVar19 | iVar20 << ((byte)it->i4_ & 0x1f);
          iVar20 = VP8IteratorRotateI4(it,it->yuv_out_);
        } while (iVar20 != 0);
      }
      uVar26 = ReconstructUV(it,rd,it->yuv_out_ + 0x10,(uint)*it->mb_ >> 2 & 3);
      uVar26 = uVar26 | uVar19;
      rd->nz = uVar26;
    }
    else {
      uVar26 = rd->nz;
    }
    goto LAB_00137065;
  }
  bVar6 = *(byte *)it->mb_;
  if (iVar20 < 2) {
    local_490 = it->enc_->dqm_[bVar6 >> 5 & 3].i4_penalty_;
    local_458 = 0x7fffffffffffff;
    local_470 = 0x7fffffffffffff;
    if ((bVar6 & 3) == 1) goto LAB_001368ba;
LAB_00136977:
    VP8IteratorStartI4(it);
    puVar40 = rd->modes_i4;
    lVar21 = 0;
    uVar19 = 0;
    do {
      uVar12 = VP8Scan[it->i4_];
      puVar29 = it->yuv_in_;
      puVar24 = GetCostModeI4(it,puVar40);
      (*VP8EncPredLuma4)(it->yuv_p_,it->i4_top_);
      uVar42 = 0xffffffff;
      puVar36 = VP8I4ModeOffsets;
      uVar47 = 0;
      lVar22 = 0x7fffffffffffff;
      do {
        iVar18 = (*VP8SSE4x4)(puVar29 + uVar12,it->yuv_p_ + *puVar36);
        lVar23 = (ulong)puVar24[uVar47] * 0xb + (long)iVar18 * 0x100;
        if (lVar23 < lVar22) {
          uVar42 = uVar47 & 0xffffffff;
        }
        if (lVar22 < lVar23) {
          lVar23 = lVar22;
        }
        uVar47 = uVar47 + 1;
        puVar36 = puVar36 + 1;
        lVar22 = lVar23;
      } while (uVar47 != 10);
      uVar7 = puVar24[(int)uVar42];
      iVar18 = it->i4_;
      puVar40[iVar18] = (uint8_t)uVar42;
      local_490 = local_490 + lVar23;
      if ((local_470 <= local_490) || (lVar21 = lVar21 + (ulong)uVar7, local_458 < lVar21))
      goto LAB_00136f8d;
      iVar18 = ReconstructIntra4(it,rd->y_ac_levels[iVar18],puVar29 + uVar12,
                                 it->yuv_out2_ + VP8Scan[iVar18],(int)uVar42);
      uVar19 = uVar19 | iVar18 << ((byte)it->i4_ & 0x1f);
      iVar18 = VP8IteratorRotateI4(it,it->yuv_out2_);
    } while (iVar18 != 0);
    VP8SetIntra4Mode(it,puVar40);
    uVar2 = it->yuv_out_;
    uVar4 = it->yuv_out2_;
    auVar50._8_4_ = (int)uVar2;
    auVar50._0_8_ = uVar4;
    auVar50._12_4_ = (int)((ulong)uVar2 >> 0x20);
    it->yuv_out_ = (uint8_t *)uVar4;
    it->yuv_out2_ = (uint8_t *)auVar50._8_8_;
  }
  else {
    local_490 = it->enc_->dqm_[bVar6 >> 5 & 3].i4_penalty_;
    local_458 = (long)it->enc_->mb_header_limit_;
LAB_001368ba:
    pbVar8 = it->yuv_in_;
    puVar40 = it->yuv_p_;
    iVar18 = -1;
    puVar24 = VP8I16ModeOffsets;
    lVar22 = 0;
    lVar21 = 0x7fffffffffffff;
    do {
      iVar13 = (*VP8SSE16x16)(pbVar8,puVar40 + *puVar24);
      local_470 = (ulong)VP8FixedCostsI16[lVar22] * 0x6a + (long)iVar13 * 0x100;
      iVar13 = (int)lVar22;
      if (lVar21 <= local_470) {
        local_470 = lVar21;
        iVar13 = iVar18;
      }
      if (lVar22 != 0 && local_458 < (long)(ulong)VP8FixedCostsI16[lVar22]) {
        local_470 = lVar21;
        iVar13 = iVar18;
      }
      iVar18 = iVar13;
      lVar22 = lVar22 + 1;
      puVar24 = puVar24 + 1;
      lVar21 = local_470;
    } while (lVar22 != 4);
    if ((it->x_ == 0) || (it->y_ == 0)) {
      iVar13 = (uint)*pbVar8 * 0x1010101;
      local_3a8._0_4_ = iVar13;
      lVar21 = 0;
      do {
        if ((((*(int *)(pbVar8 + lVar21) != iVar13) || (*(int *)(pbVar8 + lVar21 + 4) != iVar13)) ||
            (*(int *)(pbVar8 + lVar21 + 8) != iVar13)) ||
           (*(int *)(pbVar8 + lVar21 + 0xc) != iVar13)) goto LAB_00136964;
        lVar21 = lVar21 + 0x20;
      } while ((int)lVar21 != 0x200);
      VP8SetIntra16Mode(it,(uint)(it->x_ != 0) * 2);
    }
    else {
LAB_00136964:
      VP8SetIntra16Mode(it,iVar18);
      if (1 < iVar20) goto LAB_00136977;
    }
LAB_00136f8d:
    uVar19 = ReconstructIntra16(it,rd,it->yuv_out_,(uint)*it->preds_);
    local_490 = local_470;
  }
  if (0 < iVar20) {
    puVar40 = it->yuv_in_;
    uVar47 = 0xffffffff;
    puVar24 = VP8UVModeOffsets;
    uVar42 = 0;
    lVar21 = 0x7fffffffffffff;
    do {
      iVar20 = (*VP8SSE16x8)(puVar40 + 0x10,it->yuv_p_ + *puVar24);
      lVar22 = (ulong)VP8FixedCostsUV[uVar42] * 0x78 + (long)iVar20 * 0x100;
      if (lVar22 < lVar21) {
        uVar47 = uVar42 & 0xffffffff;
      }
      if (lVar22 <= lVar21) {
        lVar21 = lVar22;
      }
      uVar42 = uVar42 + 1;
      puVar24 = puVar24 + 1;
    } while (uVar42 != 4);
    VP8SetIntraUVMode(it,(int)uVar47);
  }
  uVar26 = ReconstructUV(it,rd,it->yuv_out_ + 0x10,(uint)*it->mb_ >> 2 & 3);
  uVar26 = uVar26 | uVar19;
  rd->nz = uVar26;
  rd->score = local_490;
LAB_00137065:
  VP8SetSkip(it,(uint)(uVar26 == 0));
  return (uint)(uVar26 == 0);
}

Assistant:

int VP8Decimate(VP8EncIterator* WEBP_RESTRICT const it,
                VP8ModeScore* WEBP_RESTRICT const rd,
                VP8RDLevel rd_opt) {
  int is_skipped;
  const int method = it->enc_->method_;

  InitScore(rd);

  // We can perform predictions for Luma16x16 and Chroma8x8 already.
  // Luma4x4 predictions needs to be done as-we-go.
  VP8MakeLuma16Preds(it);
  VP8MakeChroma8Preds(it);

  if (rd_opt > RD_OPT_NONE) {
    it->do_trellis_ = (rd_opt >= RD_OPT_TRELLIS_ALL);
    PickBestIntra16(it, rd);
    if (method >= 2) {
      PickBestIntra4(it, rd);
    }
    PickBestUV(it, rd);
    if (rd_opt == RD_OPT_TRELLIS) {   // finish off with trellis-optim now
      it->do_trellis_ = 1;
      SimpleQuantize(it, rd);
    }
  } else {
    // At this point we have heuristically decided intra16 / intra4.
    // For method >= 2, pick the best intra4/intra16 based on SSE (~tad slower).
    // For method <= 1, we don't re-examine the decision but just go ahead with
    // quantization/reconstruction.
    RefineUsingDistortion(it, (method >= 2), (method >= 1), rd);
  }
  is_skipped = (rd->nz == 0);
  VP8SetSkip(it, is_skipped);
  return is_skipped;
}